

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getSum_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  TestError *this_00;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  undefined1 local_21;
  reference local_20;
  testCase *test_case;
  InitializerListTest *this_local;
  string *sum;
  
  test_case = (testCase *)this;
  this_local = (InitializerListTest *)__return_storage_ptr__;
  local_20 = std::
             vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
             ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  local_21 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(local_20->m_initializer) {
  case VECTOR:
    getVectorSum_abi_cxx11_(&local_48,this,getSum::var,local_20->m_n_rows);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    break;
  case MATRIX:
  case MATRIX_ROWS:
    getVectorArraySum_abi_cxx11_
              (&local_78,this,"variable[INDEX]",local_20->m_n_cols,local_20->m_n_rows);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    break;
  case STRUCT:
    getVectorSum_abi_cxx11_(&local_98,this,"variable.member_a",local_20->m_n_rows);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&local_b8,this,"variable.member_b",local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b8);
    break;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               "variable[0] + variable[1] + variable[2] + variable[3]");
    break;
  case ARRAY_VECTOR_CTR:
  case ARRAY_VECTOR_LIST:
  case UNSIZED_ARRAY_VECTOR:
    getVectorArraySum_abi_cxx11_(&local_d8,this,"variable[INDEX]",4,local_20->m_n_rows);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    break;
  case ARRAY_MATRIX_CTR:
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_MATRIX:
    getVectorArraySum_abi_cxx11_
              (&local_f8,this,"variable[0][INDEX]",local_20->m_n_cols,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_
              (&local_118,this,"variable[1][INDEX]",local_20->m_n_cols,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_
              (&local_138,this,"variable[2][INDEX]",local_20->m_n_cols,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_
              (&local_158,this,"variable[3][INDEX]",local_20->m_n_cols,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_158);
    break;
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    getVectorArraySum_abi_cxx11_(&local_178,this,"variable[INDEX].member_a",4,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&local_198,this,"variable[INDEX].member_b",4,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_198);
    break;
  case NESTED_STRUCT_CTR:
  case NESTED_STRUCT_LIST:
    getVectorSum_abi_cxx11_(&local_1b8,this,"variable.member_a.member_a",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&local_1d8,this,"variable.member_a.member_b",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&local_1f8,this,"variable.member_b",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_1f8);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    getVectorSum_abi_cxx11_(&local_218,this,"variable.member_a",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&local_238,this,"variable.member_b[INDEX].member_a",3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&local_258,this,"variable.member_b[INDEX].member_b",3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_258);
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    getVectorArraySum_abi_cxx11_(&local_278,this,"variable[INDEX].member_a.member_a",4,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&local_298,this,"variable[INDEX].member_a.member_b",4,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&local_2b8,this,"variable[INDEX].member_b",4,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_2b8);
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    getVectorSum_abi_cxx11_(&local_2d8,this,"variable.member_a.member_a",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorArraySum_abi_cxx11_(&local_2f8,this,"variable.member_a.member_b[INDEX]",2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorSum_abi_cxx11_(&local_318,this,"variable.member_b",4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_318);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x37e8);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getSum()
{
	static const GLchar* var = "variable";

	const testCase& test_case = m_test_cases[m_current_test_case_index];

	std::string sum;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		sum = getVectorSum(var, test_case.m_n_rows);

		break;

	case MATRIX:
	case MATRIX_ROWS:
		sum = getVectorArraySum("variable[INDEX]", test_case.m_n_cols, test_case.m_n_rows);

		break;

	case STRUCT:
		sum = getVectorSum("variable.member_a", test_case.m_n_rows);
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_b", test_case.m_n_rows));

		break;

	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		sum = "variable[0] + variable[1] + variable[2] + variable[3]";

		break;

	case ARRAY_VECTOR_LIST:
	case ARRAY_VECTOR_CTR:
	case UNSIZED_ARRAY_VECTOR:
		sum = getVectorArraySum("variable[INDEX]", 4 /* columns */, test_case.m_n_rows);

		break;

	case ARRAY_MATRIX_LIST:
	case ARRAY_MATRIX_CTR:
	case UNSIZED_ARRAY_MATRIX:
		sum.append(getVectorArraySum("variable[0][INDEX]", test_case.m_n_cols, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[1][INDEX]", test_case.m_n_cols, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[2][INDEX]", test_case.m_n_cols, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[3][INDEX]", test_case.m_n_cols, test_case.m_n_rows));

		break;

	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		sum.append(getVectorArraySum("variable[INDEX].member_a", 4, test_case.m_n_rows));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[INDEX].member_b", 4, test_case.m_n_rows));

		break;

	case NESTED_STRUCT_CTR:
	case NESTED_STRUCT_LIST:
		sum.append(getVectorSum("variable.member_a.member_a", 4));
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_a.member_b", 4));
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_b", 4));

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		sum.append(getVectorSum("variable.member_a", 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable.member_b[INDEX].member_a", 3, 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable.member_b[INDEX].member_b", 3, 4));

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		sum.append(getVectorArraySum("variable[INDEX].member_a.member_a", 4, 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[INDEX].member_a.member_b", 4, 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable[INDEX].member_b", 4, 4));

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		sum.append(getVectorSum("variable.member_a.member_a", 4));
		sum.append(" + ");
		sum.append(getVectorArraySum("variable.member_a.member_b[INDEX]", 2, 4));
		sum.append(" + ");
		sum.append(getVectorSum("variable.member_b", 4));

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return sum;
}